

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_block.cc
# Opt level: O0

void __thiscall leveldb::FilterBlockBuilder::AddKey(FilterBlockBuilder *this,Slice *key)

{
  char *pcVar1;
  undefined8 *in_RSI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  Slice k;
  pointer *__x;
  Slice local_20 [2];
  
  local_20[0].data_ = (char *)*in_RSI;
  local_20[0].size_ = in_RSI[1];
  __x = &in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
  std::__cxx11::string::size();
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            (in_RDI,(value_type_conflict1 *)__x);
  pcVar1 = Slice::data(local_20);
  Slice::size(local_20);
  std::__cxx11::string::append
            ((char *)&(in_RDI->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                      _M_impl.super__Vector_impl_data._M_finish,(ulong)pcVar1);
  return;
}

Assistant:

void FilterBlockBuilder::AddKey(const Slice& key) {
  Slice k = key;
  start_.push_back(keys_.size());
  keys_.append(k.data(), k.size());
}